

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

Result<wasm::Ok> *
wasm::WATParser::typeuse<wasm::WATParser::ParseDeclsCtx>
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx,bool allowNames)

{
  _Uninitialized<unsigned_long,_true> _Var1;
  undefined8 *puVar2;
  undefined1 *puVar3;
  iterator __position;
  bool bVar4;
  bool bVar5;
  size_t sVar6;
  string_view expected;
  undefined8 *local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined1 local_d0 [8];
  MaybeResult<wasm::Ok> namedParams;
  long local_98;
  size_t local_88;
  undefined1 local_80 [8];
  MaybeResult<unsigned_long> _val_2;
  MaybeResult<unsigned_long> resultTypes;
  
  sVar6 = (ctx->in).pos;
  expected._M_str = "type";
  expected._M_len = 4;
  bVar4 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar4) {
    local_88 = sVar6;
    typeidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)local_d0,ctx);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::Err>::_Copy_ctor_base
              ((_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)
               ((long)&_val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20),
               (_Copy_ctor_base<false,_wasm::Ok,_wasm::Err> *)local_d0);
    if (resultTypes.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x01') {
      _Var1._M_storage =
           (long)&_val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 8;
      local_80 = (undefined1  [8])_Var1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,
                 _val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._32_8_,
                 (long)resultTypes.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u.
                       _M_first._M_storage +
                 _val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._32_8_);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
      if (local_80 == (undefined1  [8])_Var1._M_storage) {
        *puVar2 = _val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._8_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
             _val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_80;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             _val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._8_8_;
      }
      ((_Uninitialized<unsigned_long,_true> *)
      ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8))->_M_storage =
           (unsigned_long)
           _val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._M_first.
           _M_storage;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&_val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20));
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                 ((long)&_val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20));
      bVar5 = Lexer::takeRParen(&ctx->in);
      sVar6 = local_88;
      if (bVar5) {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
                  ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_d0);
        goto LAB_00b888f6;
      }
      namedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ =
           &stack0xffffffffffffff68;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 ((long)&namedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),
                 "expected end of type use","");
      Lexer::err((Err *)((long)&_val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>
                                .super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20)
                 ,&ctx->in,
                 (string *)
                 ((long)&namedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20));
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
      puVar3 = (undefined1 *)
               ((long)&resultTypes.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 8);
      if ((undefined1 *)
          _val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._32_8_ == puVar3) {
        *puVar2 = CONCAT71(resultTypes.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>
                           .super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                           super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u.
                           _9_7_,resultTypes.val.
                                 super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                                 super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                 super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                 super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                 super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                 super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                 _M_u._8_1_);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
             resultTypes.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined8 *)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
             _val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._32_8_;
        *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             CONCAT71(resultTypes.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._9_7_,
                      resultTypes.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                      super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._8_1_)
        ;
      }
      ((_Uninitialized<unsigned_long,_true> *)
      ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8))->_M_storage =
           (unsigned_long)
           resultTypes.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._M_first.
           _M_storage;
      resultTypes.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._M_first._M_storage =
           (_Uninitialized<unsigned_long,_true>)0;
      resultTypes.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._8_1_ = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      _val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._32_8_ = puVar3;
      if ((long *)namedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_ !=
          &stack0xffffffffffffff68) {
        operator_delete((void *)namedParams.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>
                                .super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_
                        ,local_98 + 1);
      }
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_d0);
  }
  else {
LAB_00b888f6:
    params<wasm::WATParser::ParseDeclsCtx>((MaybeResult<wasm::Ok> *)local_d0,ctx,allowNames);
    std::__detail::__variant::_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                    ((long)&_val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20),
                    (_Copy_ctor_base<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_d0);
    if (resultTypes.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02') {
      _Var1._M_storage =
           (long)&_val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 8;
      local_80 = (undefined1  [8])_Var1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,
                 _val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._32_8_,
                 (long)resultTypes.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u.
                       _M_first._M_storage +
                 _val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._32_8_);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
      if (local_80 == (undefined1  [8])_Var1._M_storage) {
        *puVar2 = _val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                  super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._8_8_;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) =
             _val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_80;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
             _val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._8_8_;
      }
      ((_Uninitialized<unsigned_long,_true> *)
      ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8))->_M_storage =
           (unsigned_long)
           _val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
           super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
           super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._M_first.
           _M_storage;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                        ((long)&_val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>
                                .super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20)
                       );
    }
    else {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                        ((long)&_val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>
                                .super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20)
                       );
      results<wasm::WATParser::ParseDeclsCtx>
                ((MaybeResult<unsigned_long> *)
                 ((long)&_val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20),ctx);
      std::__detail::__variant::_Copy_ctor_base<false,_unsigned_long,_wasm::None,_wasm::Err>::
      _Copy_ctor_base((_Copy_ctor_base<false,_unsigned_long,_wasm::None,_wasm::Err> *)local_80,
                      (_Copy_ctor_base<false,_unsigned_long,_wasm::None,_wasm::Err> *)
                      ((long)&_val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                              super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20));
      if (_val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u._24_1_ == '\x02')
      {
        local_f0 = &local_e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_80,
                   (undefined1 *)
                   ((long)_val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<unsigned_long,_wasm::None,_wasm::Err>._M_u.
                          _M_first._M_storage + (long)local_80));
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar2;
        if (local_f0 == &local_e0) {
          *puVar2 = local_e0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_d8;
        }
        else {
          *(undefined8 **)
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err> = local_f0;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) = local_e0;
        }
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_e8;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
        std::__detail::__variant::_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err> *)local_80)
        ;
      }
      else {
        std::__detail::__variant::_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err> *)local_80)
        ;
        local_80._0_4_ = (uint)sVar6;
        if (!bVar4) {
          __position._M_current =
               (ctx->implicitTypeDefs).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (ctx->implicitTypeDefs).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&ctx->implicitTypeDefs,
                       __position,(uint *)local_80);
          }
          else {
            *__position._M_current = (uint)sVar6;
            (ctx->implicitTypeDefs).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
      }
      std::__detail::__variant::_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_unsigned_long,_wasm::None,_wasm::Err> *)
                        ((long)&_val_2.val.super__Variant_base<unsigned_long,_wasm::None,_wasm::Err>
                                .super__Move_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<unsigned_long,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<unsigned_long,_wasm::None,_wasm::Err> + 0x20)
                       );
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<typename Ctx::TypeUseT> typeuse(Ctx& ctx, bool allowNames) {
  auto pos = ctx.in.getPos();
  std::optional<typename Ctx::HeapTypeT> type;
  if (ctx.in.takeSExprStart("type"sv)) {
    auto x = typeidx(ctx);
    CHECK_ERR(x);

    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of type use");
    }

    type = *x;
  }

  auto namedParams = params(ctx, allowNames);
  CHECK_ERR(namedParams);

  auto resultTypes = results(ctx);
  CHECK_ERR(resultTypes);

  return ctx.makeTypeUse(pos, type, namedParams.getPtr(), resultTypes.getPtr());
}